

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper.cpp
# Opt level: O0

Format __thiscall VRasterBuffer::prepare(VRasterBuffer *this,VBitmap *image)

{
  Format FVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  VBitmap *in_RSI;
  Format *in_RDI;
  
  puVar2 = VBitmap::data(in_RSI);
  *(uint8_t **)(in_RDI + 0x28) = puVar2;
  uVar3 = VBitmap::width(in_RSI);
  *(undefined8 *)(in_RDI + 8) = uVar3;
  uVar3 = VBitmap::height(in_RSI);
  *(undefined8 *)(in_RDI + 0x10) = uVar3;
  in_RDI[0x20] = 4;
  in_RDI[0x21] = Invalid;
  in_RDI[0x22] = Invalid;
  in_RDI[0x23] = Invalid;
  in_RDI[0x24] = Invalid;
  in_RDI[0x25] = Invalid;
  in_RDI[0x26] = Invalid;
  in_RDI[0x27] = Invalid;
  uVar3 = VBitmap::stride(in_RSI);
  *(undefined8 *)(in_RDI + 0x18) = uVar3;
  FVar1 = VBitmap::format(in_RSI);
  *in_RDI = FVar1;
  return *in_RDI;
}

Assistant:

VBitmap::Format VRasterBuffer::prepare(const VBitmap *image)
{
    mBuffer = image->data();
    mWidth = image->width();
    mHeight = image->height();
    mBytesPerPixel = 4;
    mBytesPerLine = image->stride();

    mFormat = image->format();
    return mFormat;
}